

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int QMetaTypeIdQObject<Qt::WindowType,_16>::qt_metatype_id(void)

{
  long lVar1;
  char *__s;
  char *__s_00;
  size_t asize;
  long in_FS_OFFSET;
  int newId;
  char *cName;
  char *eName;
  int id;
  QByteArray typeName;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QByteArray *in_stack_ffffffffffffff90;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x20dae8);
  if (local_2c == 0) {
    __s = Qt::qt_getEnumName(Widget);
    Qt::qt_getEnumMetaObject(Widget);
    __s_00 = QMetaObject::className
                       ((QMetaObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                       );
    QByteArray::QByteArray((QByteArray *)0x20db50);
    asize = strlen(__s_00);
    strlen(__s);
    QByteArray::reserve(in_stack_ffffffffffffff90,asize);
    QByteArray::append((QByteArray *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QByteArray::append((QByteArray *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QByteArray::append((QByteArray *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_2c = qRegisterNormalizedMetaType<Qt::WindowType>((QByteArray *)0x20dbcb);
    QBasicAtomicInteger<int>::storeRelease
              ((QBasicAtomicInteger<int> *)CONCAT44(local_2c,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
    QByteArray::~QByteArray((QByteArray *)0x20dbfb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *eName = qt_getEnumName(T());
        const char *cName = qt_getEnumMetaObject(T())->className();
        QByteArray typeName;
        typeName.reserve(strlen(cName) + 2 + strlen(eName));
        typeName.append(cName).append("::").append(eName);
        const int newId = qRegisterNormalizedMetaType<T>(typeName);
        metatype_id.storeRelease(newId);
        return newId;
    }